

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *p,int iFrame,abctime Time)

{
  int *piVar1;
  uint level;
  int iVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pObj;
  long lVar5;
  void *pvVar6;
  Vec_Ptr_t *p_00;
  abctime time;
  Ssw_RarPars_t *pSVar7;
  char *pStr;
  ulong uVar8;
  long lVar9;
  
  p->iFailPo = -1;
  p->iFailPat = -1;
  for (lVar9 = 0; lVar9 < p->pAig->nTruePos; lVar9 = lVar9 + 1) {
    iVar3 = (int)lVar9;
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iVar3);
    lVar5 = (long)p->pAig->nConstrs;
    if ((lVar5 != 0) && (p->pAig->nTruePos - lVar5 <= lVar9)) break;
    if (((p->vCexes == (Vec_Ptr_t *)0x0) ||
        (pvVar6 = Vec_PtrEntry(p->vCexes,iVar3), pvVar6 == (void *)0x0)) &&
       (iVar2 = Ssw_RarManPoIsConst0(p,pObj), iVar2 == 0)) {
      p->iFailPo = iVar3;
      iVar2 = Ssw_RarManObjWhichOne(p,pObj);
      p->iFailPat = iVar2;
      if (p->pPars->fSolveAll == 0) break;
      piVar1 = &p->pPars->nSolved;
      *piVar1 = *piVar1 + 1;
      p_00 = p->vCexes;
      if (p_00 == (Vec_Ptr_t *)0x0) {
        iVar2 = p->pAig->nTruePos;
        p_00 = Vec_PtrAlloc(iVar2);
        p_00->nSize = iVar2;
        memset(p_00->pArray,0,(long)iVar2 << 3);
        p->vCexes = p_00;
      }
      pvVar6 = Vec_PtrEntry(p_00,iVar3);
      if (pvVar6 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(p->vCexes, i) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                      ,0x26b,"int Ssw_RarManCheckNonConstOutputs(Ssw_RarMan_t *, int, abctime)");
      }
      if (p->vCexes->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      p->vCexes->pArray[lVar9] = (void *)0x1;
      pSVar7 = p->pPars;
      if (pSVar7->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
        iVar3 = (*pSVar7->pFuncOnFail)(iVar3,(Abc_Cex_t *)0x0);
        if (iVar3 != 0) {
          return 2;
        }
        pSVar7 = p->pPars;
      }
      if (pSVar7->fNotVerbose == 0) {
        level = p->pAig->nTruePos;
        uVar8 = (ulong)level;
        if (1 < level) {
          uVar8 = 0;
          for (uVar4 = level - 1; uVar4 != 0; uVar4 = uVar4 / 10) {
            uVar8 = (ulong)((int)uVar8 + 1);
          }
        }
        pStr = "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ";
        Abc_Print(level,"Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ",
                  uVar8,(ulong)(uint)p->iFailPo,(ulong)(uint)iFrame,uVar8,
                  (ulong)(uint)pSVar7->nSolved,uVar8,(ulong)level);
        Abc_PrintTime((int)Time,pStr,time);
      }
    }
  }
  return (uint)~p->iFailPo >> 0x1f;
}

Assistant:

int Ssw_RarManCheckNonConstOutputs( Ssw_RarMan_t * p, int iFrame, abctime Time )
{
    Aig_Obj_t * pObj;
    int i;
    p->iFailPo  = -1;
    p->iFailPat = -1;
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        if ( p->pAig->nConstrs && i >= Saig_ManPoNum(p->pAig) - p->pAig->nConstrs )
            break;
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        if ( Ssw_RarManPoIsConst0(p, pObj) )
            continue;
        p->iFailPo  = i;
        p->iFailPat = Ssw_RarManObjWhichOne( p, pObj );
        if ( !p->pPars->fSolveAll )
            break;
        // remember the one solved
        p->pPars->nSolved++;
        if ( p->vCexes == NULL )
            p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        assert( Vec_PtrEntry(p->vCexes, i) == NULL );
        Vec_PtrWriteEntry( p->vCexes, i, (void *)(ABC_PTRINT_T)1 );
        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(i, NULL) )
            return 2; // quitting due to callback
        // print final report
        if ( !p->pPars->fNotVerbose )
        {
            int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
            Abc_Print( 1, "Output %*d was asserted in frame %4d (solved %*d out of %*d outputs).  ", 
                nOutDigits, p->iFailPo, iFrame, 
                nOutDigits, p->pPars->nSolved, 
                nOutDigits, Saig_ManPoNum(p->pAig) );
            Abc_PrintTime( 1, "Time", Time );
        }
    }
    if ( p->iFailPo >= 0 ) // found CEX
        return 1;
    else
        return 0;
}